

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

int64_t duckdb::DateSub::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                  (date_t startdate,date_t enddate)

{
  timestamp_t enddate_00;
  timestamp_t startdate_00;
  long lVar1;
  int32_t in_ESI;
  int32_t in_EDI;
  dtime_t t0;
  undefined4 in_stack_ffffffffffffffc8;
  dtime_t local_10;
  date_t local_8;
  date_t local_4;
  
  local_8.days = in_ESI;
  local_4.days = in_EDI;
  dtime_t::dtime_t(&local_10,0);
  duckdb::Timestamp::FromDatetime(local_4,local_10);
  startdate_00.value = duckdb::Timestamp::FromDatetime(local_8,local_10);
  enddate_00.value._4_4_ = local_8.days;
  enddate_00.value._0_4_ = in_stack_ffffffffffffffc8;
  lVar1 = Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(startdate_00,enddate_00);
  return lVar1;
}

Assistant:

int64_t DateSub::SecondsOperator::Operation(date_t startdate, date_t enddate) {
	dtime_t t0(0);
	return SecondsOperator::Operation<timestamp_t, timestamp_t, int64_t>(Timestamp::FromDatetime(startdate, t0),
	                                                                     Timestamp::FromDatetime(enddate, t0));
}